

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O2

void __thiscall fat::create_new_file(fat *this,string *file_path,string *fat_path)

{
  vector<fat::directory,_std::allocator<fat::directory>_> *this_00;
  char cVar1;
  ushort uVar2;
  uint uVar3;
  value_type vVar4;
  boot_record *pbVar5;
  int32_t *piVar6;
  char *__src;
  undefined8 uVar7;
  long lVar8;
  int32_t iVar9;
  FILE *pFVar10;
  size_t sVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  ostream *poVar15;
  ulong uVar16;
  short sVar17;
  int i_1;
  ulong uVar18;
  fat *pfVar19;
  string *psVar20;
  undefined1 *puVar21;
  fat *pfVar22;
  int i;
  int iVar23;
  size_t __size;
  char *__dest;
  int16_t i_2;
  short sVar24;
  int j;
  size_t sStack_190;
  int32_t aiStack_188 [2];
  char local_180 [8];
  directory root;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  size_type *local_118;
  string content;
  string extension;
  string cropped_file_name;
  undefined1 local_a0 [8];
  string file_name;
  vector<fat::directory,_std::allocator<fat::directory>_> children;
  _Vector_base<int,_std::allocator<int>_> local_58;
  string *local_40;
  fat *local_38;
  
  local_118 = (size_type *)CONCAT71(local_118._1_7_,0x2f);
  sStack_190 = 0x104f75;
  local_38 = this;
  explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&name.field_2 + 8),(fat *)file_path,fat_path,(char *)&local_118);
  cropped_file_name.field_2._8_8_ = 0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sStack_190 = 0x104f9f;
  pFVar10 = fopen((file_path->_M_dataplus)._M_p,"r");
  if (pFVar10 == (FILE *)0x0) {
    sStack_190 = 0x1056d1;
    poVar15 = std::operator<<((ostream *)&std::cout,"FILE NOT FOUND");
    sStack_190 = 0x1056d9;
    std::endl<char,std::char_traits<char>>(poVar15);
  }
  else {
    sStack_190 = 0x104fbf;
    local_40 = file_path;
    fseek(pFVar10,0,2);
    sStack_190 = 0x104fc7;
    sVar11 = ftell(pFVar10);
    sStack_190 = 0x104fd6;
    fseek(pFVar10,0,0);
    local_118 = &content._M_string_length;
    sStack_190 = 0x104ff2;
    std::__cxx11::string::_M_construct((ulong)&local_118,(char)sVar11);
    sStack_190 = 0x10500e;
    fread(local_118,sVar11,1,pFVar10);
    sStack_190 = 0x105016;
    fclose(pFVar10);
    uVar18 = (ulong)content._M_dataplus._M_p / (ulong)(long)local_38->fs_br->cluster_size;
    for (iVar23 = 0; iVar23 < (int)uVar18; iVar23 = iVar23 + 1) {
      sStack_190 = 0x10506a;
      std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_118);
      sStack_190 = 0x105075;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (cropped_file_name.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      sStack_190 = 0x10507d;
      std::__cxx11::string::~string((string *)local_a0);
    }
    if ((ulong)content._M_dataplus._M_p % (ulong)(long)local_38->fs_br->cluster_size != 0) {
      sStack_190 = 0x1050c0;
      std::__cxx11::string::substr((ulong)local_a0,(ulong)&local_118);
      sStack_190 = 0x1050d3;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (cropped_file_name.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      sStack_190 = 0x1050df;
      std::__cxx11::string::~string((string *)local_a0);
    }
    for (uVar18 = 0; psVar20 = local_40,
        uVar18 < (ulong)((long)-cropped_file_name.field_2._8_8_ >> 5); uVar18 = uVar18 + 1) {
      sStack_190 = 0x10510c;
      local_a0._0_4_ = get_first_free_cluster(local_38);
      sStack_190 = 0x10511d;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_58,(int *)local_a0);
    }
    if ((long)local_58._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58._M_impl.super__Vector_impl_data._M_start >> 2 !=
        (long)-cropped_file_name.field_2._8_8_ >> 5) {
      sStack_190 = 0x1056f8;
      __assert_fail("free_clusters.size() == split_content.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/honzaseda[P]ZOS/fat.cpp"
                    ,0x7a,"void fat::create_new_file(std::string, std::string)");
    }
    sStack_190 = 0x105151;
    std::__cxx11::string::find_last_of((char *)local_40,0x109179);
    sStack_190 = 0x105167;
    std::__cxx11::string::substr((ulong)local_a0,(ulong)psVar20);
    pfVar22 = local_38;
    sStack_190 = 0x105184;
    std::__cxx11::string::find_last_of(local_a0,0x10904c);
    sStack_190 = 0x105198;
    std::__cxx11::string::substr((ulong)((long)&content.field_2 + 8),(ulong)local_a0);
    sStack_190 = 0x1051b0;
    std::__cxx11::string::substr((ulong)&root.size,(ulong)((long)&content.field_2 + 8));
    sStack_190 = 0x1051bc;
    std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
    sStack_190 = 0x1051d2;
    std::__cxx11::string::find_last_of(local_a0,0x10904c);
    sStack_190 = 0x1051e8;
    std::__cxx11::string::substr((ulong)((long)&extension.field_2 + 8),(ulong)local_a0);
    sStack_190 = 0x105200;
    std::__cxx11::string::substr
              ((ulong)((long)&content.field_2 + 8),(ulong)((long)&extension.field_2 + 8));
    sStack_190 = 0x10520c;
    std::__cxx11::string::~string((string *)(extension.field_2._M_local_buf + 8));
    sStack_190 = 0x105223;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&file_name.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&root.size,
                   ".");
    sStack_190 = 0x10523a;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&extension.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&file_name.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&content.field_2 + 8));
    sStack_190 = 0x105243;
    std::__cxx11::string::~string((string *)(file_name.field_2._M_local_buf + 8));
    local_180[0] = '\0';
    local_180[1] = '\0';
    local_180[2] = '\0';
    local_180[3] = '\0';
    local_180[4] = '\0';
    local_180[5] = '\0';
    local_180[6] = '\0';
    local_180[7] = '\0';
    root.name[0] = '\0';
    root.name[1] = '\0';
    root.name[2] = '\0';
    root.name[3] = '\0';
    root.name[4] = '\0';
    root.name[5] = '\x01';
    sStack_190 = 0x105267;
    strcpy(local_180,(char *)extension.field_2._8_8_);
    root.name._8_4_ = SUB84(sVar11,0);
    sStack_190 = 0x10527a;
    pvVar12 = std::vector<int,_std::allocator<int>_>::at
                        ((vector<int,_std::allocator<int>_> *)&local_58,0);
    root._12_4_ = *pvVar12;
    sStack_190 = 0x105295;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&result.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&name.field_2 + 8));
    sStack_190 = 0x1052a4;
    iVar9 = get_parent_cluster(pfVar22,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&result.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sStack_190 = 0x1052b3;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&result.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (iVar9 < 0) {
      sStack_190 = 0x10570b;
      poVar15 = std::operator<<((ostream *)&std::cout,"PATH NOT FOUND");
      sStack_190 = 0x105713;
      std::endl<char,std::char_traits<char>>(poVar15);
    }
    else {
      sStack_190 = 0x1052cb;
      get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)
                       ((long)&file_name.field_2 + 8),pfVar22,iVar9);
      if ((ulong)(((long)children.
                         super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl
                         .super__Vector_impl_data._M_start - file_name.field_2._8_8_) / 0x18) <
          (ulong)(long)pfVar22->fs_br->cluster_size / 0x18) {
        uVar18 = 0;
        this_00 = (vector<fat::directory,_std::allocator<fat::directory>_> *)
                  ((long)&file_name.field_2 + 8);
        do {
          if ((ulong)(((long)children.
                             super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
                             _M_impl.super__Vector_impl_data._M_start - file_name.field_2._8_8_) /
                     0x18) <= uVar18) {
            pbVar5 = pfVar22->fs_br;
            sStack_190 = 0x105395;
            fseek((FILE *)pfVar22->fs,
                  (long)iVar9 * (long)pbVar5->cluster_size +
                  (long)pbVar5->usable_cluster_count * (long)pbVar5->fat_copies * 4 + 0x110,0);
            sVar17 = 0x18;
            for (uVar18 = 0; pfVar22 = local_38,
                uVar18 < (ulong)(((long)children.
                                        super__Vector_base<fat::directory,_std::allocator<fat::directory>_>
                                        ._M_impl.super__Vector_impl_data._M_start -
                                 file_name.field_2._8_8_) / 0x18); uVar18 = uVar18 + 1) {
              sStack_190 = 0x1053be;
              pvVar13 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at
                                  ((vector<fat::directory,_std::allocator<fat::directory>_> *)
                                   ((long)&file_name.field_2 + 8),uVar18);
              sStack_190 = 0x1053d4;
              fwrite(pvVar13,0x18,1,(FILE *)local_38->fs);
              sVar17 = sVar17 + 0x18;
            }
            sStack_190 = 0x1053f7;
            fwrite(local_180,0x18,1,(FILE *)local_38->fs);
            for (sVar24 = 0; (int)sVar24 < (int)pfVar22->fs_br->cluster_size - (int)sVar17;
                sVar24 = sVar24 + 1) {
              sStack_190 = 0x10541f;
              fputc(0,(FILE *)pfVar22->fs);
            }
            puVar21 = (undefined1 *)(ulong)(uint)pfVar22->fs_br->usable_cluster_count;
            lVar8 = -((long)puVar21 * 4 + 0xfU & 0xfffffffffffffff0);
            psVar20 = (string *)((long)aiStack_188 + lVar8);
            piVar6 = pfVar22->fat_table;
            uVar3 = pfVar22->fs_br->usable_cluster_count;
            uVar16 = 0;
            uVar18 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              uVar18 = uVar16;
            }
            for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
              *(int32_t *)((long)psVar20 + uVar16 * 4) = piVar6[uVar16];
            }
            uVar18 = 0;
            local_40 = (string *)puVar21;
            while (uVar16 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_58._M_impl.super__Vector_impl_data._M_start >> 2,
                  uVar18 < uVar16) {
              if (uVar16 - 1 == uVar18) {
                iVar9 = pfVar22->FAT_FILE_END;
                *(undefined8 *)((long)aiStack_188 + lVar8 + -8) = 0x1054a1;
                pvVar12 = std::vector<int,_std::allocator<int>_>::at
                                    ((vector<int,_std::allocator<int>_> *)&local_58,uVar18);
                *(int32_t *)((long)psVar20 + (long)*pvVar12 * 4) = iVar9;
                pfVar22 = local_38;
                uVar18 = uVar18 + 1;
              }
              else {
                *(undefined8 *)((long)aiStack_188 + lVar8 + -8) = 0x1054c0;
                pvVar12 = std::vector<int,_std::allocator<int>_>::at
                                    ((vector<int,_std::allocator<int>_> *)&local_58,uVar18 + 1);
                vVar4 = *pvVar12;
                *(undefined8 *)((long)aiStack_188 + lVar8 + -8) = 0x1054cd;
                pvVar12 = std::vector<int,_std::allocator<int>_>::at
                                    ((vector<int,_std::allocator<int>_> *)&local_58,uVar18);
                *(value_type *)((long)psVar20 + (long)*pvVar12 * 4) = vVar4;
                pfVar22 = local_38;
                uVar18 = uVar18 + 1;
              }
            }
            pFVar10 = (FILE *)pfVar22->fs;
            *(undefined8 *)((long)aiStack_188 + lVar8 + -8) = 0x1054f2;
            fseek(pFVar10,0x110,0);
            __size = (long)local_40 << 2;
            *(undefined8 *)((long)aiStack_188 + lVar8 + -8) = 1;
            sVar11 = *(size_t *)((long)aiStack_188 + lVar8 + -8);
            for (iVar23 = 0; iVar23 < pfVar22->fs_br->fat_copies; iVar23 = iVar23 + 1) {
              pFVar10 = (FILE *)pfVar22->fs;
              *(undefined8 *)((long)aiStack_188 + lVar8 + -8) = 0x105521;
              fwrite(psVar20,__size,sVar11,pFVar10);
            }
            pfVar19 = (fat *)0x0;
            while (pfVar19 < (fat *)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_58._M_impl.super__Vector_impl_data._M_start >> 2))
            {
              uVar2 = pfVar22->fs_br->cluster_size;
              lVar8 = -(ulong)(uVar2 + 0xf & 0xfffffff0);
              __dest = (char *)((long)psVar20 + lVar8);
              local_40 = psVar20;
              builtin_strncpy((char *)((long)psVar20 + lVar8 + -8),"nU\x10",4);
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              memset(__dest,0,(ulong)uVar2);
              local_38 = pfVar19;
              __dest[-8] = -0x7f;
              __dest[-7] = 'U';
              __dest[-6] = '\x10';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              pvVar14 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&cropped_file_name.field_2 + 8),(size_type)pfVar19);
              __src = (pvVar14->_M_dataplus)._M_p;
              __dest[-8] = -0x74;
              __dest[-7] = 'U';
              __dest[-6] = '\x10';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              strcpy(__dest,__src);
              pFVar10 = (FILE *)pfVar22->fs;
              cVar1 = pfVar22->fs_br->fat_copies;
              iVar23 = pfVar22->fs_br->usable_cluster_count;
              __dest[-8] = -0x4a;
              __dest[-7] = 'U';
              __dest[-6] = '\x10';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              fseek(pFVar10,(long)iVar23 * (long)cVar1 * 4 + 0x110,0);
              pfVar19 = local_38;
              pFVar10 = (FILE *)pfVar22->fs;
              sVar17 = pfVar22->fs_br->cluster_size;
              __dest[-8] = -0x2d;
              __dest[-7] = 'U';
              __dest[-6] = '\x10';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              pvVar12 = std::vector<int,_std::allocator<int>_>::at
                                  ((vector<int,_std::allocator<int>_> *)&local_58,(size_type)pfVar19
                                  );
              iVar23 = *pvVar12;
              __dest[-8] = '\x01';
              __dest[-7] = '\0';
              __dest[-6] = '\0';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              uVar7 = *(undefined8 *)(__dest + -8);
              __dest[-8] = -0x1b;
              __dest[-7] = 'U';
              __dest[-6] = '\x10';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              fseek(pFVar10,(long)iVar23 * (long)sVar17,(int)uVar7);
              pFVar10 = (FILE *)pfVar22->fs;
              __dest[-8] = '\x01';
              __dest[-7] = '\0';
              __dest[-6] = '\0';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              sVar11 = *(size_t *)(__dest + -8);
              __dest[-8] = -9;
              __dest[-7] = 'U';
              __dest[-6] = '\x10';
              __dest[-5] = '\0';
              __dest[-4] = '\0';
              __dest[-3] = '\0';
              __dest[-2] = '\0';
              __dest[-1] = '\0';
              fwrite(__dest,(ulong)uVar2,sVar11,pFVar10);
              psVar20 = local_40;
              pfVar19 = (fat *)&local_38->NEW_FAT_COPIES;
            }
            *(undefined8 *)((long)psVar20 + -8) = 0x10561a;
            poVar15 = std::operator<<((ostream *)&std::cout,"OK");
            *(undefined8 *)((long)psVar20 + -8) = 0x105622;
            std::endl<char,std::char_traits<char>>(poVar15);
            sStack_190 = 0x10562f;
            std::_Vector_base<fat::directory,_std::allocator<fat::directory>_>::~_Vector_base
                      ((_Vector_base<fat::directory,_std::allocator<fat::directory>_> *)
                       ((long)&file_name.field_2 + 8));
            sStack_190 = 0x10563b;
            std::__cxx11::string::~string((string *)(extension.field_2._M_local_buf + 8));
            sStack_190 = 0x105647;
            std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
            sStack_190 = 0x105653;
            std::__cxx11::string::~string((string *)&root.size);
            sStack_190 = 0x10565f;
            std::__cxx11::string::~string((string *)local_a0);
            sStack_190 = 0x10566b;
            std::__cxx11::string::~string((string *)&local_118);
            sStack_190 = 0x105674;
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
            sStack_190 = 0x105680;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&cropped_file_name.field_2 + 8));
            sStack_190 = 0x10568c;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&name.field_2 + 8));
            return;
          }
          sStack_190 = 0x105321;
          pvVar13 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at(this_00,uVar18)
          ;
          sStack_190 = 0x105330;
          iVar23 = strcmp(pvVar13->name,(char *)extension.field_2._8_8_);
          if (iVar23 == 0) {
            sStack_190 = 0x10533f;
            pvVar13 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at
                                (this_00,uVar18);
            if (pvVar13->is_file == true) {
              sStack_190 = 0x1056ae;
              poVar15 = std::operator<<((ostream *)&std::cout,"NAME ALREADY EXISTS");
              sStack_190 = 0x1056b6;
              std::endl<char,std::char_traits<char>>(poVar15);
              goto LAB_001056b6;
            }
          }
          uVar18 = uVar18 + 1;
        } while( true );
      }
      sStack_190 = 0x105728;
      poVar15 = std::operator<<((ostream *)&std::cout,"DIRECTORY IS FULL");
      sStack_190 = 0x105730;
      std::endl<char,std::char_traits<char>>(poVar15);
    }
  }
LAB_001056b6:
  sStack_190 = 0x1056be;
  exit(1);
}

Assistant:

void fat::create_new_file(std::string file_path, std::string fat_path) {
    FILE *fnew;
    std::vector<std::string> result = explode(fat_path, '/');

    struct directory root;
    std::vector<std::string> split_content = std::vector<std::string>();
    std::vector<int32_t> free_clusters = std::vector<int32_t>();

    // ---
    // Reading the input file and storing its content into a string vector
    // ---
    if((fnew = fopen(file_path.c_str(), "r")) == NULL){
        std::cout << "FILE NOT FOUND" << std::endl;
        exit(1);
    }
    fseek(fnew, 0, SEEK_END);
    long fsize = ftell(fnew);
    fseek(fnew, 0, SEEK_SET);
    std::string content(fsize, '\0');
    fread(&content[0], fsize, 1, fnew);
    fclose(fnew);
    int NumSubstrings = content.length() / fs_br->cluster_size;
    for (auto i = 0; i < NumSubstrings; i++) {
        split_content.push_back(content.substr(i * fs_br->cluster_size, fs_br->cluster_size));
    }
    if (content.length() % fs_br->cluster_size != 0) {
        split_content.push_back(content.substr(fs_br->cluster_size * NumSubstrings));
    }

    for (int i = 0; i < split_content.size(); i++) {
        free_clusters.push_back(get_first_free_cluster());
    }
    assert(free_clusters.size() == split_content.size());

    // ---
    // Updating the parent directory content
    // ---
    std::string file_name = file_path.substr(file_path.find_last_of("/") + 1);
    std::string name = file_name.substr(0, file_name.find_last_of(".")).substr(0,8);
    std::string extension = file_name.substr(file_name.find_last_of(".") + 1).substr(0,3);
    std::string cropped_file_name = name + "." + extension;

    memset(root.name, '\0', sizeof(root.name));
    root.is_file = 1;
    strcpy(root.name, cropped_file_name.c_str());
    root.size = fsize;
    root.start_cluster = free_clusters.at(0);

    int32_t parent = get_parent_cluster(result);
    if (parent < 0) {
        std::cout << "PATH NOT FOUND" << std::endl;
        exit(1);
    }
    std::vector<fat::directory> children = get_dir_children(parent);
    long max_cluster_dirs = fs_br->cluster_size / sizeof(struct directory);
    if(children.size() >= max_cluster_dirs){
        std::cout << "DIRECTORY IS FULL" << std::endl;
        exit(1);
    }
    for(int i = 0; i < children.size(); i++){
        if((strcmp(children.at(i).name, cropped_file_name.c_str()) == 0) && children.at(i).is_file){
            std::cout << "NAME ALREADY EXISTS" << std::endl;
            exit(1);
        }
    }
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               parent * fs_br->cluster_size), SEEK_SET);
    int16_t ac_size = 0;
    for (int j = 0; j < children.size(); j++) {
        fwrite(&children.at(j), sizeof(directory), 1, fs);
        ac_size += sizeof(directory);
    }
    fwrite(&root, sizeof(root), 1, fs);
    ac_size += sizeof(directory);
    char buffer[] = {'\0'};
    for (int16_t i = 0; i < (fs_br->cluster_size - ac_size); i++) {
        fwrite(buffer, sizeof(buffer), 1, fs);
    }

    // ---
    // Updating all FAT table copies
    // ---
    int32_t new_fat[fs_br->usable_cluster_count];
    for (int k = 0; k < fs_br->usable_cluster_count; k++) {
        new_fat[k] = fat_table[k];
    }
    for (int x = 0; x < free_clusters.size(); x++) {
        if (x != free_clusters.size() - 1) {
            new_fat[free_clusters.at(x)] = free_clusters.at(x + 1);
        } else {
            new_fat[free_clusters.at(x)] = FAT_FILE_END;
        }
    }
    fseek(fs, sizeof(boot_record), SEEK_SET);
    for (int i = 0; i < fs_br->fat_copies; i++) {
        fwrite(&new_fat, sizeof(new_fat), 1, fs);
    }

    // ---
    // Inserting the input file content into FAT clusters
    // ---
    for (int i = 0; i < free_clusters.size(); i++) {
        char cluster[fs_br->cluster_size];
        memset(cluster, '\0', sizeof(cluster));
        strcpy(cluster, split_content.at(i).c_str());

        fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count)),
              SEEK_SET);
        fseek(fs, fs_br->cluster_size * free_clusters.at(i), SEEK_CUR);
        fwrite(&cluster, sizeof(cluster), 1, fs);
    }
    std::cout << "OK" << std::endl;
}